

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O1

wchar_t scp_send_dirname(char *name,wchar_t modes)

{
  Backend *pBVar1;
  _Bool _Var2;
  wchar_t wVar3;
  char *path;
  size_t sVar4;
  sftp_request *psVar5;
  sftp_packet *psVar6;
  char *pcVar7;
  fxp_attrs attrs;
  fxp_attrs local_58;
  
  if (using_sftp) {
    if (scp_sftp_targetisdir) {
      path = dupcat_fn(scp_sftp_remotepath,"/",name,0);
    }
    else {
      path = dupstr(scp_sftp_remotepath);
    }
    psVar5 = fxp_mkdir_send(path,(fxp_attrs *)0x0);
    psVar6 = sftp_wait_for_reply(psVar5);
    _Var2 = fxp_mkdir_recv(psVar6,psVar5);
    if (_Var2) {
      pcVar7 = "server reported no error";
    }
    else {
      pcVar7 = fxp_error();
    }
    psVar5 = fxp_stat_send(path);
    psVar6 = sftp_wait_for_reply(psVar5);
    _Var2 = fxp_stat_recv(psVar6,psVar5,&local_58);
    if (((_Var2) && (((byte)local_58.flags & 4) != 0)) && ((local_58.permissions._1_1_ & 0x40) != 0)
       ) {
      wVar3 = L'\0';
      scp_sftp_remotepath = path;
    }
    else {
      tell_user(_stderr,"unable to create directory %s: %s",path,pcVar7);
      safefree(path);
      errs = errs + L'\x01';
      wVar3 = L'\x01';
    }
  }
  else {
    sprintf((char *)&local_58,"D%04o 0 ",modes);
    pBVar1 = backend;
    sVar4 = strlen((char *)&local_58);
    (*pBVar1->vt->send)(pBVar1,(char *)&local_58,sVar4);
    pBVar1 = backend;
    sVar4 = strlen(name);
    (*pBVar1->vt->send)(pBVar1,name,sVar4);
    (*backend->vt->send)(backend,"\n",1);
    wVar3 = response();
  }
  return wVar3;
}

Assistant:

int scp_send_dirname(const char *name, int modes)
{
    if (using_sftp) {
        char *fullname;
        char const *err;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (scp_sftp_targetisdir) {
            fullname = dupcat(scp_sftp_remotepath, "/", name);
        } else {
            fullname = dupstr(scp_sftp_remotepath);
        }

        /*
         * We don't worry about whether we managed to create the
         * directory, because if it exists already it's OK just to
         * use it. Instead, we will stat it afterwards, and if it
         * exists and is a directory we will assume we were either
         * successful or it didn't matter.
         */
        req = fxp_mkdir_send(fullname, NULL);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_mkdir_recv(pktin, req);

        if (!ret)
            err = fxp_error();
        else
            err = "server reported no error";

        req = fxp_stat_send(fullname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) ||
            !(attrs.permissions & 0040000)) {
            tell_user(stderr, "unable to create directory %s: %s",
                      fullname, err);
            sfree(fullname);
            errs++;
            return 1;
        }

        scp_sftp_remotepath = fullname;

        return 0;
    } else {
        char buf[40];
        sprintf(buf, "D%04o 0 ", modes);
        backend_send(backend, buf, strlen(buf));
        backend_send(backend, name, strlen(name));
        backend_send(backend, "\n", 1);
        return response();
    }
}